

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.cc
# Opt level: O1

void __thiscall Monitor::process(Monitor *this,string *json)

{
  int *piVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first;
  iterator iVar2;
  iterator iVar3;
  DatagramSocket *this_00;
  bool bVar4;
  int iVar5;
  key_type *pkVar6;
  reference j;
  ostream *poVar7;
  undefined8 *puVar8;
  runtime_error *this_01;
  size_t __n;
  void *__buf;
  int in_R8D;
  iterator result;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  data;
  iterator it;
  string error;
  stringstream statsd;
  float local_26c;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_268;
  undefined1 local_248 [8];
  json_value local_240;
  undefined1 local_238 [24];
  primitive_iterator_t local_220;
  undefined1 *local_218;
  long local_210;
  undefined1 local_208;
  undefined7 uStack_207;
  vector<int,std::allocator<int>> *local_1f8;
  vector<int,_std::allocator<int>_> *local_1f0;
  vector<float,_std::allocator<float>_> *local_1e8;
  vector<float,_std::allocator<float>_> *local_1e0;
  _Any_data local_1d8;
  code *local_1c8;
  undefined8 uStack_1c0;
  input_adapter local_1b8;
  long local_1a8 [14];
  ios_base local_138 [264];
  
  local_218 = &local_208;
  local_210 = 0;
  local_208 = 0;
  first._M_current = (json->_M_dataplus)._M_p;
  nlohmann::detail::input_adapter::
  input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_0>
            (&local_1b8,first,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(first._M_current + json->_M_string_length));
  local_1c8 = (code *)0x0;
  uStack_1c0 = 0;
  local_1d8._M_unused._M_object = (void *)0x0;
  local_1d8._8_8_ = 0;
  __n = 1;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::parse((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           *)local_248,&local_1b8,(parser_callback_t *)&local_1d8,true);
  if (local_1c8 != (code *)0x0) {
    (*local_1c8)(&local_1d8,&local_1d8,__destroy_functor);
  }
  if (local_1b8.ia.
      super___shared_ptr<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1b8.ia.
               super___shared_ptr<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_210 != 0) {
    puVar8 = (undefined8 *)__cxa_allocate_exception(8);
    this_01 = (runtime_error *)operator_new(0x10);
    std::runtime_error::runtime_error(this_01,(string *)&local_218);
    *puVar8 = this_01;
    __cxa_throw(puVar8,&std::runtime_error*::typeinfo,0);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::begin((iterator *)local_238,
          (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           *)local_248);
  local_1f8 = (vector<int,std::allocator<int>> *)&(this->stats_).reedSolomonErrors;
  local_1f0 = &(this->stats_).viterbiErrors;
  local_1e8 = &(this->stats_).omega;
  local_1e0 = &(this->stats_).frequency;
  do {
    local_268.m_object = (pointer)local_248;
    if ((local_248[0] != array) && (local_248[0] != object)) {
      __n = 0x8000000000000000;
    }
    local_268.m_it.primitive_iterator.m_it = -0x8000000000000000;
    local_268.m_it.array_iterator._M_current = (pointer)0x0;
    local_268.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    if (local_248[0] == array) {
      local_268.m_it.array_iterator._M_current =
           ((local_240.array)->
           super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else if (local_248[0] == object) {
      local_268.m_it.object_iterator._M_node =
           &((local_240.object)->_M_t)._M_impl.super__Rb_tree_header._M_header;
    }
    else {
      local_268.m_it.primitive_iterator.m_it = 1;
    }
    bVar4 = nlohmann::detail::
            iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::operator==((iterator *)local_238,&local_268);
    if (bVar4) {
      this_00 = (this->statsd_)._M_t.
                super___uniq_ptr_impl<DatagramSocket,_std::default_delete<DatagramSocket>_>._M_t.
                super__Tuple_impl<0UL,_DatagramSocket_*,_std::default_delete<DatagramSocket>_>.
                super__Head_base<0UL,_DatagramSocket_*,_false>._M_head_impl;
      if (this_00 != (DatagramSocket *)0x0) {
        std::__cxx11::stringbuf::str();
        DatagramSocket::send(this_00,(int)local_238,__buf,__n,in_R8D);
        if ((pointer)local_238._0_8_ != (pointer)(local_238 + 0x10)) {
          operator_delete((void *)local_238._0_8_,(ulong)(local_238._16_8_ + 1));
        }
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
      std::ios_base::~ios_base(local_138);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::json_value::destroy((json_value *)(local_248 + 8),local_248[0]);
      if (local_218 != &local_208) {
        operator_delete(local_218,CONCAT71(uStack_207,local_208) + 1);
      }
      return;
    }
    pkVar6 = nlohmann::detail::
             iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
             ::key((iterator *)local_238);
    j = nlohmann::detail::
        iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
        ::operator*((iterator *)local_238);
    iVar5 = std::__cxx11::string::compare((char *)pkVar6);
    if (iVar5 == 0) {
      nlohmann::detail::
      get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_double,_0>
                (j,(double *)&local_268);
      local_26c = (float)(double)local_268.m_object;
      iVar2._M_current =
           (this->stats_).gain.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this->stats_).gain.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                  ((vector<float,_std::allocator<float>_> *)this,iVar2,&local_26c);
      }
      else {
        *iVar2._M_current = local_26c;
        (this->stats_).gain.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(pkVar6->_M_dataplus)._M_p,pkVar6->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,":",1);
      nlohmann::detail::
      get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_double,_0>
                (j,(double *)&local_268);
      poVar7 = std::ostream::_M_insert<double>((double)local_268.m_object);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"|g",2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
LAB_0013d508:
      std::ostream::put((char)poVar7);
      std::ostream::flush();
    }
    else {
      iVar5 = std::__cxx11::string::compare((char *)pkVar6);
      if (iVar5 == 0) {
        nlohmann::detail::
        get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_double,_0>
                  (j,(double *)&local_268);
        local_26c = (float)(double)local_268.m_object;
        iVar2._M_current =
             (this->stats_).frequency.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (this->stats_).frequency.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                    (local_1e0,iVar2,&local_26c);
        }
        else {
          *iVar2._M_current = local_26c;
          (this->stats_).frequency.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(pkVar6->_M_dataplus)._M_p,pkVar6->_M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,":0|g",4);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(pkVar6->_M_dataplus)._M_p,pkVar6->_M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,":",1);
        nlohmann::detail::
        get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_double,_0>
                  (j,(double *)&local_268);
        poVar7 = std::ostream::_M_insert<double>((double)local_268.m_object);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"|g",2);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        goto LAB_0013d508;
      }
      iVar5 = std::__cxx11::string::compare((char *)pkVar6);
      if (iVar5 == 0) {
        nlohmann::detail::
        get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_double,_0>
                  (j,(double *)&local_268);
        local_26c = (float)(double)local_268.m_object;
        iVar2._M_current =
             (this->stats_).omega.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (this->stats_).omega.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                    (local_1e8,iVar2,&local_26c);
        }
        else {
          *iVar2._M_current = local_26c;
          (this->stats_).omega.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(pkVar6->_M_dataplus)._M_p,pkVar6->_M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,":",1);
        nlohmann::detail::
        get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_double,_0>
                  (j,(double *)&local_268);
        poVar7 = std::ostream::_M_insert<double>((double)local_268.m_object);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"|g",2);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        goto LAB_0013d508;
      }
      iVar5 = std::__cxx11::string::compare((char *)pkVar6);
      if (iVar5 == 0) {
        nlohmann::detail::
        from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_int,_0>
                  (j,(int *)&local_268);
        local_26c = local_268.m_object._0_4_;
        iVar3._M_current =
             (this->stats_).viterbiErrors.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (this->stats_).viterbiErrors.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (local_1f0,iVar3,(int *)&local_26c);
        }
        else {
          *iVar3._M_current = (int)local_268.m_object._0_4_;
          (this->stats_).viterbiErrors.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar3._M_current + 1;
        }
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(pkVar6->_M_dataplus)._M_p,pkVar6->_M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,":",1);
        nlohmann::detail::
        from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_int,_0>
                  (j,(int *)&local_268);
        poVar7 = (ostream *)
                 std::ostream::operator<<((ostream *)poVar7,(int)local_268.m_object._0_4_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"|h",2);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        goto LAB_0013d508;
      }
      iVar5 = std::__cxx11::string::compare((char *)pkVar6);
      if (iVar5 == 0) {
        nlohmann::detail::
        from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_int,_0>
                  (j,(int *)&local_268);
        local_26c = local_268.m_object._0_4_;
        if (-1 < (int)local_268.m_object._0_4_) {
          iVar3._M_current =
               (this->stats_).reedSolomonErrors.super__Vector_base<int,_std::allocator<int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (this->stats_).reedSolomonErrors.super__Vector_base<int,_std::allocator<int>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (local_1f8,iVar3,(int *)&local_26c);
          }
          else {
            *iVar3._M_current = (int)local_268.m_object._0_4_;
            (this->stats_).reedSolomonErrors.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar3._M_current + 1;
          }
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(pkVar6->_M_dataplus)._M_p,
                              pkVar6->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,":",1);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,(int)local_26c);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"|h",2);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
        }
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)pkVar6);
        if (iVar5 == 0) {
          nlohmann::detail::
          from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_int,_0>
                    (j,(int *)&local_268);
          if (local_268.m_object._0_4_ == 0.0) {
            piVar1 = &(this->stats_).totalDropped;
            *piVar1 = *piVar1 + 1;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"packets_ok:0|c",0xe);
            std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + (char)local_1a8);
            std::ostream::put((char)local_1a8);
            std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"packets_dropped:1|c",0x13);
            std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + (char)local_1a8);
          }
          else {
            piVar1 = &(this->stats_).totalOK;
            *piVar1 = *piVar1 + 1;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"packets_ok:1|c",0xe);
            std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + (char)local_1a8);
            std::ostream::put((char)local_1a8);
            std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"packets_dropped:0|c",0x13);
            std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + (char)local_1a8);
          }
          std::ostream::put((char)local_1a8);
          std::ostream::flush();
        }
      }
    }
    if (*(value_t *)local_238._0_8_ == array) {
      local_238._16_8_ = local_238._16_8_ + 0x10;
    }
    else if (*(value_t *)local_238._0_8_ == object) {
      local_238._8_8_ = std::_Rb_tree_increment((_Rb_tree_node_base *)local_238._8_8_);
    }
    else {
      local_220.m_it = local_220.m_it + 1;
    }
  } while( true );
}

Assistant:

void Monitor::process(const std::string& json) {
  std::string error;
  auto data = json::parse(json);
  if (!error.empty()) {
    throw new std::runtime_error(error);
  }

  // Accumulate statsd compatible payload
  std::stringstream statsd;

  for (json::iterator it = data.begin(); it != data.end(); ++it) {
    const auto& key = it.key();
    const auto& value = it.value();

    if (key == "gain") {
      stats_.gain.push_back(value.get<double>());
      statsd << key << ":" << value.get<double>() << "|g" << std::endl;
      continue;
    }

    if (key == "frequency") {
      stats_.frequency.push_back(value.get<double>());
      // First set to 0 to support negative values.
      // See: https://github.com/etsy/statsd/blob/master/docs/metric_types.md#gauges
      statsd << key << ":0|g" << std::endl;
      statsd << key << ":" << value.get<double>() << "|g" << std::endl;
      continue;
    }

    if (key == "omega") {
      stats_.omega.push_back(value.get<double>());
      statsd << key << ":" << value.get<double>() << "|g" << std::endl;
      continue;
    }

    if (key == "viterbi_errors") {
      stats_.viterbiErrors.push_back(value.get<int>());
      statsd << key << ":" << value.get<int>() << "|h" << std::endl;
      continue;
    }

    if (key == "reed_solomon_errors") {
      const auto& v = value.get<int>();
      if (v >= 0) {
        stats_.reedSolomonErrors.push_back(v);
        statsd << key << ":" << v << "|h" << std::endl;
      }
      continue;
    }

    if (key == "ok") {
      const auto& ok = value.get<int>();
      if (ok != 0) {
        stats_.totalOK++;
        statsd << "packets_ok:1|c" << std::endl;
        statsd << "packets_dropped:0|c" << std::endl;
      } else {
        stats_.totalDropped++;
        statsd << "packets_ok:0|c" << std::endl;
        statsd << "packets_dropped:1|c" << std::endl;
      }
      continue;
    }
  }

  if (statsd_) {
    statsd_->send(statsd.str());
  }
}